

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  Mem_Flex_t *pMan;
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_01;
  Abc_Obj_t *pFanin;
  word *puTruth;
  char *pcVar5;
  int RetValue;
  int Fanin;
  int k;
  int i;
  word *pTruth;
  Abc_Obj_t *pNode;
  Vec_Int_t *vArray;
  Vec_Int_t *vMap;
  Vec_Int_t *vCover;
  Sfm_Ntk_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p_00 = Vec_IntStart(iVar1);
  for (Fanin = 0; iVar1 = Abc_NtkCiNum(pNtk), Fanin < iVar1; Fanin = Fanin + 1) {
    pAVar4 = Abc_NtkCi(pNtk,Fanin);
    iVar1 = (pAVar4->field_6).iTemp;
    uVar2 = Abc_ObjId(pAVar4);
    Vec_IntWriteEntry(p_00,iVar1,uVar2);
  }
  for (Fanin = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Fanin < iVar1; Fanin = Fanin + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Fanin);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (0 < (pAVar4->field_6).iTemp)) {
      iVar1 = (pAVar4->field_6).iTemp;
      uVar2 = Abc_ObjId(pAVar4);
      Vec_IntWriteEntry(p_00,iVar1,uVar2);
    }
  }
  for (Fanin = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Fanin < iVar1; Fanin = Fanin + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Fanin);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (iVar1 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp), iVar1 == 0)) {
      Abc_ObjRemoveFanins(pAVar4);
    }
  }
  vMemory = Vec_IntAlloc(0x10000);
  Fanin = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= Fanin) {
      Vec_IntFree(vMemory);
      Vec_IntFree(p_00);
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,Fanin);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (((pAVar4->field_6).iTemp != 0 &&
        (iVar1 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp), iVar1 == 0)))) {
      iVar1 = Sfm_NodeReadUsed(p,(pAVar4->field_6).iTemp);
      if (iVar1 == 0) {
        Abc_NtkDeleteObj(pAVar4);
      }
      else {
        p_01 = Sfm_NodeReadFanins(p,(pAVar4->field_6).iTemp);
        for (RetValue = 0; iVar1 = Vec_IntSize(p_01), RetValue < iVar1; RetValue = RetValue + 1) {
          iVar1 = Vec_IntEntry(p_01,RetValue);
          iVar1 = Vec_IntEntry(p_00,iVar1);
          pFanin = Abc_NtkObj(pNtk,iVar1);
          Abc_ObjAddFanin(pAVar4,pFanin);
        }
        puTruth = Sfm_NodeReadTruth(p,(pAVar4->field_6).iTemp);
        if (*puTruth == 0) {
          pcVar5 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc," 0\n");
          (pAVar4->field_5).pData = pcVar5;
        }
        else if (*puTruth == 0xffffffffffffffff) {
          pcVar5 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc," 1\n");
          (pAVar4->field_5).pData = pcVar5;
        }
        else {
          iVar1 = Vec_IntSize(p_01);
          iVar1 = Kit_TruthIsop((uint *)puTruth,iVar1,vMemory,1);
          iVar3 = Vec_IntSize(p_01);
          if (iVar3 < 1) {
            __assert_fail("Vec_IntSize(vArray) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                          ,0xe4,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
          }
          if ((iVar1 != 0) && (iVar1 != 1)) {
            __assert_fail("RetValue == 0 || RetValue == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                          ,0xe5,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
          }
          pMan = (Mem_Flex_t *)pNtk->pManFunc;
          iVar3 = Vec_IntSize(p_01);
          pcVar5 = Abc_SopCreateFromIsop(pMan,iVar3,vMemory);
          (pAVar4->field_5).pData = pcVar5;
          if (iVar1 != 0) {
            Abc_SopComplement((char *)(pAVar4->field_5).pData);
          }
        }
        iVar1 = Abc_SopGetVarNum((char *)(pAVar4->field_5).pData);
        iVar3 = Vec_IntSize(p_01);
        if (iVar1 != iVar3) {
          __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                        ,0xea,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
        }
      }
    }
    Fanin = Fanin + 1;
  } while( true );
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        // update function
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        if ( pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 0\n" );
        else if ( ~pTruth[0] == 0 )
            pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 1\n" );
        else
        {
            int RetValue = Kit_TruthIsop( (unsigned *)pTruth, Vec_IntSize(vArray), vCover, 1 );
            assert( Vec_IntSize(vArray) > 0 );
            assert( RetValue == 0 || RetValue == 1 );
            pNode->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), vCover );
            if ( RetValue )
                Abc_SopComplement( (char *)pNode->pData );
        }
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}